

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::renderQuad
          (SupportedTextureType *this,RenderContext *context,GLint reductionMode)

{
  GLenum GVar1;
  code *pcVar2;
  void *pvVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar7;
  long lVar8;
  long *plVar9;
  vector<float,_std::allocator<float>_> texCoords;
  deUint16 quadIndices [6];
  ShaderProgram program;
  VertexArrayBinding vertexArrays [2];
  float position [8];
  ProgramSources sources;
  long *local_2e0;
  long local_2d8;
  long local_2d0 [2];
  void *local_2c0 [2];
  long local_2b0;
  undefined1 local_2a8 [24];
  string local_290 [8];
  long local_288;
  Shader *local_280 [2];
  int local_270;
  deUint32 local_200;
  char local_1d8;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  char local_1b0 [16];
  int local_1a0;
  VertexComponentType local_198;
  VertexComponentConversion VStack_194;
  int iStack_190;
  int iStack_18c;
  int local_188;
  undefined4 *local_180;
  undefined4 local_178;
  long *local_170 [2];
  long local_160 [2];
  undefined4 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined4 local_138;
  void *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined8 local_118;
  undefined1 *puStack_110;
  undefined1 local_100 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8 [5];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  iVar4 = (*context->_vptr_RenderContext[3])(context);
  lVar8 = CONCAT44(extraout_var,iVar4);
  local_2a8._0_8_ = (pointer)0x2000200010000;
  local_2a8._8_4_ = 0x30001;
  local_118 = 0xbf8000003f800000;
  puStack_110 = &DAT_3f8000003f800000;
  local_128 = 0xbf800000;
  uStack_124 = 0xbf800000;
  uStack_120 = 0xbf800000;
  uStack_11c = 0x3f800000;
  (*this->_vptr_SupportedTextureType[1])(local_2c0,this);
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"position","");
  local_2a8._16_4_ = 1;
  local_290 = (string  [8])local_280;
  std::__cxx11::string::_M_construct<char*>
            (local_290,local_100._0_8_,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_100._0_8_)->_M_p +
             CONCAT44(local_100._12_4_,local_100._8_4_)));
  local_270 = 0;
  local_1c8._0_4_ = local_2a8._16_4_;
  local_1c0._M_p = local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_290,local_288 + (long)local_290);
  local_1a0 = local_270;
  local_198 = VTX_COMP_FLOAT;
  VStack_194 = VTX_COMP_CONVERT_NONE;
  iStack_190 = 2;
  iStack_18c = 4;
  local_188 = 0;
  local_180 = &local_128;
  if (local_290 != (string  [8])local_280) {
    operator_delete((void *)local_290,(ulong)((long)&local_280[0]->m_gl + 1));
  }
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"inTexcoord","");
  pvVar3 = local_2c0[0];
  local_2a8._16_4_ = 1;
  local_290 = (string  [8])local_280;
  std::__cxx11::string::_M_construct<char*>(local_290,local_2e0,local_2d8 + (long)local_2e0);
  local_270 = 0;
  local_178 = local_2a8._16_4_;
  plVar9 = local_160;
  local_170[0] = plVar9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_170,local_290,local_288 + (long)local_290);
  local_150 = local_270;
  local_148 = 8;
  uStack_140 = 0x400000001;
  local_138 = 0;
  local_130 = pvVar3;
  if (local_290 != (string  [8])local_280) {
    operator_delete((void *)local_290,(ulong)((long)&local_280[0]->m_gl + 1));
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0,local_2d0[0] + 1);
  }
  if ((pointer)local_100._0_8_ != (pointer)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  pcVar2 = *(code **)(lVar8 + 0xb8);
  GVar1 = this->m_type;
  iVar4 = (**this->_vptr_SupportedTextureType)(this);
  (*pcVar2)(GVar1,iVar4);
  dVar5 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar5,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0xb1);
  (**(code **)(lVar8 + 0x1360))(this->m_type,0x2800,0x2601);
  (**(code **)(lVar8 + 0x1360))(this->m_type,0x2801,0x2601);
  (**(code **)(lVar8 + 0x1360))(this->m_type,0x9366,reductionMode);
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100,&this->m_vertexShader);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_e8,&this->m_fragmentShader);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)(local_2a8 + 0x10),context,(ProgramSources *)local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar7 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  if (local_1d8 != '\0') {
    (**(code **)(lVar8 + 0x1680))(local_200);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"glUseProgram failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0xbe);
    pcVar2 = *(code **)(lVar8 + 0x14f0);
    uVar6 = (**(code **)(lVar8 + 0xb48))(local_200,"sampler");
    (*pcVar2)(uVar6,0);
    dVar5 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar5,"glUniform1i failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                    ,0xc1);
    (**(code **)(lVar8 + 0x188))(0x4000);
    local_100._0_8_ = &DAT_600000001;
    local_100._8_4_ = INDEXTYPE_UINT16;
    local_100._16_8_ = local_2a8;
    glu::draw(context,local_200,2,(VertexArrayBinding *)local_1c8,(PrimitiveList *)local_100,
              (DrawUtilCallback *)0x0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)(local_2a8 + 0x10));
    lVar8 = -0xa0;
    do {
      if (plVar9 != (long *)plVar9[-2]) {
        operator_delete((long *)plVar9[-2],*plVar9 + 1);
      }
      plVar9 = plVar9 + -10;
      lVar8 = lVar8 + 0x50;
    } while (lVar8 != 0);
    if (local_2c0[0] != (void *)0x0) {
      operator_delete(local_2c0[0],local_2b0 - (long)local_2c0[0]);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
             ,0xba);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureFilterMinmaxUtils::SupportedTextureType::renderQuad(const glu::RenderContext& context,
																glw::GLint				  reductionMode)
{
	const glw::Functions& gl = context.getFunctions();

	deUint16 const quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	float const position[] = { -1.0f, -1.0f, -1.0f, 1.0f, 1.0f, -1.0f, 1.0f, 1.0f };

	std::vector<float> texCoords = getTexCoords();

	glu::VertexArrayBinding vertexArrays[] = { glu::va::Float("position", 2, 4, 0, position),
											   glu::va::Float("inTexcoord", 1, 4, 0, texCoords.data()) };

	gl.bindTexture(m_type, this->getTextureGL());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texParameteri(m_type, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
	gl.texParameteri(m_type, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
	gl.texParameteri(m_type, GL_TEXTURE_REDUCTION_MODE_ARB, reductionMode);

	glu::ShaderProgram program(context, glu::makeVtxFragSources(m_vertexShader, m_fragmentShader));
	if (!program.isOk())
	{
		TCU_FAIL("Shader compilation failed");
	}

	gl.useProgram(program.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram failed");

	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i failed");

	gl.clear(GL_COLOR_BUFFER_BIT);

	glu::draw(context, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), vertexArrays,
			  glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), quadIndices));
}